

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O0

int KillAll(PClassActor *cls)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  AActor *this;
  TFlags<ActorFlag3,_unsigned_int> local_40;
  TFlags<ActorFlag2,_unsigned_int> local_3c;
  undefined1 local_38 [8];
  TThinkerIterator<AActor> iterator;
  int killcount;
  AActor *actor;
  PClassActor *cls_local;
  
  iterator.super_FThinkerIterator._20_4_ = 0;
  TThinkerIterator<AActor>::TThinkerIterator
            ((TThinkerIterator<AActor> *)local_38,&cls->super_PClass,0x80);
  while (this = TThinkerIterator<AActor>::Next((TThinkerIterator<AActor> *)local_38),
        this != (AActor *)0x0) {
    bVar1 = DObject::IsA((DObject *)this,&cls->super_PClass);
    if (bVar1) {
      TFlags<ActorFlag2,_unsigned_int>::operator&
                (&local_3c,(int)this + (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
      uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_3c);
      bVar1 = false;
      if (uVar2 == 0) {
        TFlags<ActorFlag3,_unsigned_int>::operator&
                  (&local_40,
                   (int)this + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_ALWAYSPUFF|MF3_NORADIUSDMG));
        uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_40);
        bVar1 = uVar2 != 0;
      }
      if (bVar1) {
        iVar3 = (*(this->super_DThinker).super_DObject._vptr_DObject[0x1f])();
        iterator.super_FThinkerIterator._20_4_ =
             (uint)((byte)iVar3 & 1) + iterator.super_FThinkerIterator._20_4_;
      }
    }
  }
  return iterator.super_FThinkerIterator._20_4_;
}

Assistant:

static int KillAll(PClassActor *cls)
{
	AActor *actor;
	int killcount = 0;
	TThinkerIterator<AActor> iterator(cls);
	while ( (actor = iterator.Next ()) )
	{
		if (actor->IsA(cls))
		{
			if (!(actor->flags2 & MF2_DORMANT) && (actor->flags3 & MF3_ISMONSTER))
					killcount += actor->Massacre ();
		}
	}
	return killcount;

}